

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMan.c
# Opt level: O3

void Nwk_ManPrintLutSizes(Nwk_Man_t *p,If_LibLut_t *pLutLib)

{
  void **ppvVar1;
  void *pvVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int Counters [256];
  uint local_418 [256];
  
  memset(local_418,0,0x400);
  lVar4 = (long)p->vObjs->nSize;
  if (0 < lVar4) {
    ppvVar1 = p->vObjs->pArray;
    lVar5 = 0;
    do {
      pvVar2 = ppvVar1[lVar5];
      if ((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x20) & 7) == 3)) {
        local_418[*(int *)((long)pvVar2 + 0x3c)] = local_418[*(int *)((long)pvVar2 + 0x3c)] + 1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  printf("LUTs by size: ");
  if (-1 < pLutLib->LutMax) {
    uVar6 = 0;
    do {
      printf("%d:%d ",uVar6 & 0xffffffff,(ulong)local_418[uVar6]);
      bVar3 = (long)uVar6 < (long)pLutLib->LutMax;
      uVar6 = uVar6 + 1;
    } while (bVar3);
  }
  return;
}

Assistant:

void Nwk_ManPrintLutSizes( Nwk_Man_t * p, If_LibLut_t * pLutLib )
{
    Nwk_Obj_t * pObj;
    int i, Counters[256] = {0};
    Nwk_ManForEachNode( p, pObj, i )
        Counters[Nwk_ObjFaninNum(pObj)]++;
    printf( "LUTs by size: " );
    for ( i = 0; i <= pLutLib->LutMax; i++ )
        printf( "%d:%d ", i, Counters[i] );
}